

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pshmbuffer.c
# Opt level: O1

psize pp_shm_buffer_get_used_space(PShmBuffer *buf)

{
  ulong uVar1;
  ulong uVar2;
  ulong *puVar3;
  psize pVar4;
  
  puVar3 = (ulong *)p_shm_get_address(buf->shm);
  uVar1 = *puVar3;
  uVar2 = puVar3[1];
  pVar4 = uVar2 - uVar1;
  if (uVar2 < uVar1 || pVar4 == 0) {
    if (uVar2 < uVar1) {
      pVar4 = (uVar2 - uVar1) + buf->size;
    }
    else {
      pVar4 = 0;
    }
  }
  return pVar4;
}

Assistant:

static psize
pp_shm_buffer_get_used_space (const PShmBuffer *buf)
{
	psize		read_pos;
	psize		write_pos;
	ppointer	addr;

	addr = p_shm_get_address (buf->shm);

	memcpy (&read_pos, (pchar *) addr + P_SHM_BUFFER_READ_OFFSET, sizeof (read_pos));
	memcpy (&write_pos, (pchar *) addr + P_SHM_BUFFER_WRITE_OFFSET, sizeof (write_pos));

	if (write_pos > read_pos)
		return write_pos - read_pos;
	else if (write_pos < read_pos)
		return (buf->size - (read_pos - write_pos));
	else
		return 0;
}